

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O2

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  pointer pVVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  Mesh *pMVar5;
  undefined8 uVar6;
  ulong uVar7;
  int theta;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  _Head_base<0UL,_embree::collide2::Mesh_*,_false> local_60;
  float local_58;
  uint local_54;
  float local_50;
  float local_4c;
  vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *local_48;
  RTCScene local_40;
  ulong local_38;
  
  local_40 = scene;
  pMVar5 = (Mesh *)::operator_new(0x38);
  pMVar5->_vptr_Mesh = (_func_int **)&PTR__Mesh_002aabf0;
  local_48 = &pMVar5->x_;
  (pMVar5->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar5->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar5->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._M_head_impl = pMVar5;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (local_48,((long)numPhi + -1) * (long)(int)numTheta + 2);
  std::vector<Triangle,_std::allocator<Triangle>_>::resize
            (&pMVar5->tris_,((long)numPhi + -1) * (long)(int)numTheta * 2);
  fVar15 = (float)(int)numTheta;
  auVar19._4_4_ = extraout_XMM0_Db;
  auVar19._0_4_ = fVar15;
  auVar19._8_4_ = extraout_XMM0_Dc;
  auVar19._12_4_ = extraout_XMM0_Dd;
  auVar20._4_4_ = extraout_XMM0_Db;
  auVar20._0_4_ = fVar15;
  auVar20._8_4_ = extraout_XMM0_Dc;
  auVar20._12_4_ = extraout_XMM0_Dd;
  auVar20 = rcpss(auVar19,auVar20);
  local_50 = (2.0 - fVar15 * auVar20._0_4_) * auVar20._0_4_;
  fVar15 = (float)numPhi;
  auVar21._4_4_ = extraout_XMM0_Db;
  auVar21._0_4_ = fVar15;
  auVar21._8_4_ = extraout_XMM0_Dc;
  auVar21._12_4_ = extraout_XMM0_Dd;
  auVar2._4_4_ = extraout_XMM0_Db;
  auVar2._0_4_ = fVar15;
  auVar2._8_4_ = extraout_XMM0_Dc;
  auVar2._12_4_ = extraout_XMM0_Dd;
  auVar20 = rcpss(auVar21,auVar2);
  local_58 = (2.0 - fVar15 * auVar20._0_4_) * auVar20._0_4_;
  (((local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[0] = (p->field_0).m128[0];
  (((local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[1] = (p->field_0).m128[1] + r;
  (((local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>)._M_impl.
    super__Vector_impl_data._M_start)->field_0).m128[2] = (p->field_0).m128[2];
  uVar7 = 0;
  while ((int)uVar7 < (int)((long)numPhi + -1)) {
    local_54 = (int)uVar7 + 1;
    fVar15 = (float)(int)local_54 * 3.1415927 * local_58;
    local_38 = uVar7;
    fVar16 = sinf(fVar15);
    local_4c = cosf(fVar15);
    local_4c = local_4c * r;
    for (iVar8 = 0; iVar8 < (int)numTheta; iVar8 = iVar8 + 1) {
      fVar17 = ((float)iVar8 + (float)iVar8) * 3.1415927 * local_50;
      pVVar1 = (local_48->super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)(int)(numTheta * (int)local_38 + iVar8);
      fVar15 = (p->field_0).m128[0];
      fVar18 = sinf(fVar17);
      pVVar1[lVar13 + 1].field_0.m128[0] = fVar18 * fVar16 * r + fVar15;
      pVVar1[lVar13 + 1].field_0.m128[1] = (p->field_0).m128[1] + local_4c;
      fVar15 = (p->field_0).m128[2];
      fVar17 = cosf(fVar17);
      pVVar1[lVar13 + 1].field_0.m128[2] = fVar17 * fVar16 * r + fVar15;
    }
    uVar7 = (ulong)local_54;
  }
  (pMVar5->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_start[(long)(int)numTheta * ((long)numPhi + -1) + 1].field_0.m128[0] =
       (p->field_0).m128[0];
  (pMVar5->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_start[((long)numPhi + -1) * (long)(int)numTheta + 1].field_0.m128[1] =
       (p->field_0).m128[1] - r;
  (pMVar5->x_).super__Vector_base<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>._M_impl.
  super__Vector_impl_data._M_start[((long)numPhi + -1) * (long)(int)numTheta + 1].field_0.m128[2] =
       (p->field_0).m128[2];
  lVar13 = 0;
  uVar7 = 0;
  while (uVar11 = (ulong)(int)numTheta, (long)uVar7 < (long)uVar11) {
    uVar7 = uVar7 + 1;
    *(int *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                     .super__Vector_impl_data._M_start)->v0 + lVar13) = (int)uVar7;
    *(undefined4 *)
     ((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
              super__Vector_impl_data._M_start)->v1 + lVar13) = 0;
    *(int *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                     .super__Vector_impl_data._M_start)->v2 + lVar13) =
         (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) %
              (long)(int)numTheta) + 1;
    lVar13 = lVar13 + 0xc;
  }
  iVar12 = 1;
  iVar8 = 0;
  while (iVar8 < numPhi + -2) {
    uVar7 = (ulong)(int)uVar7;
    lVar13 = uVar7 * 0xc;
    iVar9 = 1;
    while( true ) {
      iVar10 = (int)uVar11;
      if (iVar10 <= iVar9 + -1) break;
      iVar3 = iVar10 * iVar8 + iVar9 % iVar10 + 1;
      iVar14 = iVar12 * iVar10 + iVar9;
      *(int *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                       _M_impl.super__Vector_impl_data._M_start)->v0 + lVar13) = iVar14;
      *(int *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                       _M_impl.super__Vector_impl_data._M_start)->v1 + lVar13) = iVar3;
      *(int *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                       _M_impl.super__Vector_impl_data._M_start)->v2 + lVar13) =
           iVar9 + iVar10 * iVar8;
      *(int *)((long)&(pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].v0 + lVar13) =
           iVar9 % iVar10 + iVar10 * (iVar8 + 1) + 1;
      *(int *)((long)&(pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].v1 + lVar13) = iVar3;
      *(int *)((long)&(pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                      _M_impl.super__Vector_impl_data._M_start[1].v2 + lVar13) = iVar14;
      uVar7 = uVar7 + 2;
      uVar11 = (ulong)numTheta;
      lVar13 = lVar13 + 0x18;
      iVar9 = iVar9 + 1;
    }
    iVar12 = iVar12 + 1;
    iVar8 = iVar8 + 1;
  }
  lVar13 = (long)(int)uVar7 * 0xc;
  for (iVar8 = 1; iVar12 = (int)uVar11, iVar8 + -1 < iVar12; iVar8 = iVar8 + 1) {
    *(int *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                     .super__Vector_impl_data._M_start)->v0 + lVar13) =
         (numPhi + -2) * iVar12 + iVar8 % iVar12 + 1;
    *(uint *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                      _M_impl.super__Vector_impl_data._M_start)->v1 + lVar13) =
         (numPhi + -1) * numTheta + 1;
    *(uint *)((long)&((pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                      _M_impl.super__Vector_impl_data._M_start)->v2 + lVar13) =
         (numPhi + -2) * numTheta + iVar8;
    uVar11 = (ulong)numTheta;
    lVar13 = lVar13 + 0xc;
  }
  uVar6 = rtcNewGeometry(g_device,0x78);
  uVar4 = rtcAttachGeometry(local_40,uVar6);
  lVar13 = (long)(pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pMVar5->tris_).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                 super__Vector_impl_data._M_start;
  rtcSetGeometryUserPrimitiveCount(uVar6,lVar13 / 0xc & 0xffffffff,lVar13 % 0xc);
  rtcSetGeometryUserData(uVar6,uVar4);
  rtcSetGeometryBoundsFunction(uVar6,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(uVar6,triangle_intersect_func);
  rtcCommitGeometry(uVar6);
  rtcReleaseGeometry(uVar6);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
  ::
  emplace_back<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>
            ((vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
              *)&meshes,
             (unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             &local_60);
  if (local_60._M_head_impl != (Mesh *)0x0) {
    (*(local_60._M_head_impl)->_vptr_Mesh[1])();
  }
  return uVar4;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  std::unique_ptr<collide2::Mesh> sphere (new collide2::Mesh());
  sphere->x_.resize (numTheta*(numPhi-1)+2);
  sphere->tris_.resize (2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  sphere->x_[0].x = p.x;
  sphere->x_[0].y = p.y + r;
  sphere->x_[0].z = p.z;

  for (int phi=0; phi<numPhi-1; phi++)
  {
    const float phif   = (phi+1)*float(pi)*rcpNumPhi;
    const float sinp   = sin(phif);
    const float cosp   = cos(phif);
    for (int theta=0; theta<numTheta; theta++)
    {
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      auto& v = sphere->x_[phi*(numTheta)+theta+1];
      v.x = p.x + r*sinp*sin(thetaf);
      v.y = p.y + r*cosp;
      v.z = p.z + r*sinp*cos(thetaf);
    }
  }
  sphere->x_[numTheta*(numPhi-1)+1].x = p.x;
  sphere->x_[numTheta*(numPhi-1)+1].y = p.y - r;
  sphere->x_[numTheta*(numPhi-1)+1].z = p.z;

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = theta+1;
    sphere->tris_[tri].v1 = 0;
    sphere->tris_[theta].v2 = (theta+1)%numTheta + 1;
    tri++;
  }

  for (int phi=0; phi<numPhi-2; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      int p00 = phi*numTheta + 1 + theta;
      int p01 = phi*numTheta + 1 + (theta+1)%numTheta;
      int p10 = (phi+1)*numTheta + 1 + theta;
      int p11 = (phi+1)*numTheta + 1 + (theta+1)%numTheta;

      sphere->tris_[tri].v0 = p10;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p00;
      tri++;

      sphere->tris_[tri].v0 = p11;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p10;
      tri++;
    }
  }

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = (theta+1)%numTheta + numTheta*(numPhi-2) + 1;
    sphere->tris_[tri].v1 = numTheta*(numPhi-1)+1;
    sphere->tris_[tri].v2 = theta + numTheta*(numPhi-2) + 1;
    tri++;
  }

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, sphere->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (sphere));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sphere->x_.data(),0,sizeof(collide2::vec_t),sphere->x_.size());
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sphere->tris_.data(),0,sizeof(Triangle),sphere->tris_.size ());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (sphere));
  //   return geomID;
  // }
}